

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formula.hpp
# Opt level: O0

void __thiscall Excel::Formula::Formula(Formula *this)

{
  undefined4 *in_RDI;
  
  *in_RDI = 0;
  *(undefined8 *)(in_RDI + 2) = 0;
  in_RDI[4] = 0xff;
  *(undefined1 *)(in_RDI + 5) = 0;
  std::__cxx11::wstring::wstring((wstring *)(in_RDI + 6));
  *(undefined2 *)(in_RDI + 0xe) = 0;
  *(undefined2 *)((long)in_RDI + 0x3a) = 0;
  return;
}

Assistant:

inline
Formula::Formula()
	:	m_valueType( UnknownValue )
	,	m_doubleValue( 0.0 )
	,	m_errorValue( UnknownError )
	,	m_boolValue( false )
	,	m_row( 0 )
	,	m_column( 0 )
{
}